

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O3

void valid_option(int argc,char **argv,char *in_path,char *out_path,int *n1,int *n2,int *level,
                 int *h_type,int *histo,int *sm,int *sp,int *sf,int *pyr,int *ssd,int *f_type,
                 float *trsh,char *i_fname,char *v_fname,char *c_fname,char *h_fname,int *nbin,
                 float *incr,int *iter,int *binary,int *row,int *col)

{
  ulong uVar1;
  float fVar2;
  disp_vect_t dVar3;
  char cVar4;
  int iVar5;
  char **__s2;
  disp_field512_t *padVar6;
  disp_field512_t *padVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  size_t sVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  qnode_ptr_t p;
  qnode_ptr_t p_00;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int extraout_EDX;
  size_t sVar17;
  size_t sVar18;
  int iVar19;
  byte bVar20;
  int iVar21;
  char *pcVar22;
  long lVar23;
  long lVar24;
  undefined4 in_register_0000003c;
  char *pcVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  float fVar40;
  float fVar41;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  string t0;
  string str_trsh;
  int iStack_2ac;
  float fStack_218;
  float fStack_214;
  char local_1a8 [92];
  int local_14c;
  uint *local_148;
  uint *local_140;
  char local_138 [88];
  char *local_e0;
  char local_d8 [80];
  int local_88 [22];
  
  pcVar25 = (char *)CONCAT44(in_register_0000003c,argc);
  local_148 = (uint *)n1;
  local_140 = (uint *)n2;
  local_e0 = out_path;
  if (argc == 1) {
LAB_0010505a:
    usage();
  }
  if (argc - 4U < 0x15) {
    *binary = 0;
    *sm = 1;
    *sp = 1;
    *sf = 0;
    *pyr = 2;
    *level = 1;
    *histo = 0;
    *ssd = 3;
    *trsh = 0.0;
    *nbin = 0;
    *iter = 10;
    builtin_strncpy(i_fname,"Undefined",10);
    builtin_strncpy(v_fname,"Undefined",10);
    builtin_strncpy(c_fname,"Undefined",10);
    builtin_strncpy(h_fname,"Undefined",10);
    bVar29 = true;
    pcVar22 = c_fname;
    pcVar25 = (char *)histo;
    if (4 < (uint)argc) {
      uVar27 = 4;
      local_14c = 0;
      do {
        __s2 = (char **)argv[uVar27];
        pcVar25 = "-NR";
        pcVar22 = (char *)__s2;
        iVar11 = strcmp("-NR",(char *)__s2);
        piVar13 = sm;
        if (iVar11 != 0) {
          bVar20 = *(byte *)__s2;
          iVar12 = -(bVar20 - 0x2d);
          iVar11 = iVar12;
          if (bVar20 == 0x2d) {
            uVar16 = *(byte *)((long)__s2 + 1) - 0x46;
            if (uVar16 == 0) {
              uVar16 = (uint)*(byte *)((long)__s2 + 2);
            }
            if (uVar16 != 0) {
              uVar16 = *(byte *)((long)__s2 + 1) - 0x43;
              if (uVar16 == 0) {
                uVar16 = (uint)*(byte *)((long)__s2 + 2);
              }
              iVar11 = -uVar16;
              goto LAB_00104383;
            }
            uVar16 = uVar27 + 1;
            if (argc <= (int)uVar16) goto LAB_00105041;
            __isoc99_sscanf(argv[uVar16],"%f",trsh);
            pcVar22 = argv[uVar16];
            pcVar25 = (char *)local_88;
            strcpy(pcVar25,pcVar22);
            if (*sf != 1) {
              *sf = 1;
              *f_type = 0;
              iVar11 = 2;
              goto LAB_00104657;
            }
LAB_00105046:
            valid_option_cold_10();
LAB_0010504b:
            valid_option_cold_7();
LAB_00105050:
            valid_option_cold_2();
          }
          else {
LAB_00104383:
            if (iVar11 == 0) {
              if ((int)(uVar27 + 3) < argc) {
                strcpy(c_fname,argv[(ulong)uVar27 + 1]);
                __isoc99_sscanf(argv[(ulong)uVar27 + 2],"%d",nbin);
                pcVar25 = argv[uVar27 + 3];
                pcVar22 = "%f";
                __isoc99_sscanf(pcVar25,"%f",incr);
                *h_type = 0;
                *histo = 1;
                iVar11 = 4;
                goto LAB_00104657;
              }
              valid_option_cold_8();
LAB_00105041:
              valid_option_cold_9();
              goto LAB_00105046;
            }
            iVar11 = iVar12;
            if (bVar20 == 0x2d) {
              uVar16 = *(byte *)((long)__s2 + 1) - 0x50;
              if (uVar16 == 0) {
                uVar16 = (uint)*(byte *)((long)__s2 + 2);
              }
              piVar13 = sp;
              if (uVar16 == 0) goto LAB_001044bd;
              uVar16 = *(byte *)((long)__s2 + 1) - 0x4c;
              if (uVar16 == 0) {
                uVar16 = (uint)*(byte *)((long)__s2 + 2);
              }
              iVar11 = -uVar16;
            }
            if (iVar11 == 0) {
              if ((int)(uVar27 + 1) < argc) {
                pcVar25 = argv[uVar27 + 1];
                piVar13 = level;
                goto LAB_0010464b;
              }
              goto LAB_0010504b;
            }
            iVar11 = iVar12;
            if (bVar20 == 0x2d) {
              uVar16 = *(byte *)((long)__s2 + 1) - 0x49;
              if (uVar16 == 0) {
                uVar16 = (uint)*(byte *)((long)__s2 + 2);
              }
              if (uVar16 == 0) {
                if ((int)(uVar27 + 1) < argc) {
                  pcVar25 = argv[uVar27 + 1];
                  piVar13 = iter;
                  goto LAB_0010464b;
                }
                goto LAB_0010507d;
              }
              uVar16 = *(byte *)((long)__s2 + 1) - 0x57;
              if (uVar16 == 0) {
                uVar16 = (uint)*(byte *)((long)__s2 + 2);
              }
              iVar11 = -uVar16;
            }
            if (iVar11 == 0) {
              if ((int)(uVar27 + 1) < argc) {
                pcVar25 = argv[uVar27 + 1];
                piVar13 = ssd;
LAB_0010464b:
                pcVar22 = "%d";
                __isoc99_sscanf(pcVar25,"%d",piVar13);
                iVar11 = 2;
                goto LAB_00104657;
              }
              goto LAB_00105078;
            }
            if (bVar20 == 0x2d) {
              uVar16 = *(byte *)((long)__s2 + 1) - 0x4e;
              if (uVar16 == 0) {
                uVar16 = (uint)*(byte *)((long)__s2 + 2);
              }
              if (uVar16 != 0) {
                uVar16 = *(byte *)((long)__s2 + 1) - 0x42;
                if (uVar16 == 0) {
                  uVar16 = (uint)*(byte *)((long)__s2 + 2);
                }
                iVar12 = -uVar16;
                goto LAB_0010444b;
              }
              if ((int)(uVar27 + 2) < argc) {
                __isoc99_sscanf(argv[(ulong)uVar27 + 1],"%d",local_148);
                pcVar25 = argv[uVar27 + 2];
                pcVar22 = "%d";
                __isoc99_sscanf(pcVar25,"%d",local_140);
                local_14c = 1;
LAB_001044ab:
                iVar11 = 3;
                goto LAB_00104657;
              }
              goto LAB_00105087;
            }
LAB_0010444b:
            if (iVar12 != 0) goto LAB_00105050;
            if ((int)(uVar27 + 2) < argc) {
              __isoc99_sscanf(argv[(ulong)uVar27 + 1],"%d",col);
              pcVar25 = argv[uVar27 + 2];
              pcVar22 = "%d";
              __isoc99_sscanf(pcVar25,"%d",row);
              *binary = 1;
              goto LAB_001044ab;
            }
          }
          valid_option_cold_3();
          goto LAB_0010505a;
        }
LAB_001044bd:
        *piVar13 = 0;
        iVar11 = 1;
LAB_00104657:
        uVar27 = uVar27 + iVar11;
      } while ((int)uVar27 < argc);
      bVar29 = local_14c == 0;
    }
    if (100 < *nbin) goto LAB_00105064;
    if (4 < *level) goto LAB_00105069;
    if ((7 < (uint)*ssd) || ((0xa8U >> (*ssd & 0x1fU) & 1) == 0)) goto LAB_00105082;
    if (bVar29) goto LAB_0010506e;
    if (*local_148 != *local_140) {
      pcVar25 = argv[1];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = pcVar25[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "/"[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(in_path,local_1a8,sVar18 + 1);
      pcVar25 = argv[2];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = pcVar25[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "/"[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      pcVar22 = local_e0;
      memcpy(local_e0,local_1a8,sVar18 + 1);
      pcVar25 = argv[3];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = in_path[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = pcVar25[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(i_fname,local_1a8,sVar18 + 1);
      local_138[2] = 0;
      local_138[0] = '-';
      local_138[1] = 'n';
      sprintf(local_d8,"%d",(ulong)*local_148);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = local_d8[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "-"[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sprintf(local_d8,"%d",(ulong)*local_140);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = local_d8[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "-w"[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sprintf(local_d8,"%d",(ulong)(uint)*ssd);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = local_d8[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "-l"[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sprintf(local_d8,"%d",(ulong)(uint)*level);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = local_d8[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "-i"[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      sprintf(local_d8,"%d",(ulong)(uint)*iter);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar23 = sVar17 + 1;
        local_1a8[sVar17 + 1] = local_138[lVar23];
        sVar17 = sVar17 + 1;
      } while (local_138[lVar23] != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = local_d8[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(local_138,local_1a8,sVar18 + 1);
      if (*sm == 0) {
        sVar17 = 0xffffffffffffffff;
        do {
          lVar23 = sVar17 + 1;
          local_1a8[sVar17 + 1] = local_138[lVar23];
          sVar17 = sVar17 + 1;
        } while (local_138[lVar23] != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = "-r"[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(local_138,local_1a8,sVar18 + 1);
      }
      if (*sp == 0) {
        sVar17 = 0xffffffffffffffff;
        do {
          lVar23 = sVar17 + 1;
          local_1a8[sVar17 + 1] = local_138[lVar23];
          sVar17 = sVar17 + 1;
        } while (local_138[lVar23] != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = "-s"[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(local_138,local_1a8,sVar18 + 1);
      }
      if (*sf != 0) {
        sVar17 = 0xffffffffffffffff;
        do {
          lVar23 = sVar17 + 1;
          local_1a8[sVar17 + 1] = local_138[lVar23];
          sVar17 = sVar17 + 1;
        } while (local_138[lVar23] != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = "-f"[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(local_138,local_1a8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          lVar23 = sVar17 + 1;
          local_1a8[sVar17 + 1] = local_138[lVar23];
          sVar17 = sVar17 + 1;
        } while (local_138[lVar23] != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = *(char *)((long)local_88 + (sVar18 - (long)(int)sVar17));
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(local_138,local_1a8,sVar18 + 1);
      }
      pcVar25 = *argv;
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = pcVar22[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = pcVar25[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(v_fname,local_1a8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = v_fname[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "."[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(v_fname,local_1a8,sVar18 + 1);
      pcVar25 = argv[3];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = v_fname[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = pcVar25[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(v_fname,local_1a8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = v_fname[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = "F"[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(v_fname,local_1a8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        cVar4 = v_fname[sVar17 + 1];
        local_1a8[sVar17 + 1] = cVar4;
        sVar17 = sVar17 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar17;
      do {
        sVar18 = sVar10;
        cVar4 = local_138[sVar18 - (long)(int)sVar17];
        local_1a8[sVar18] = cVar4;
        sVar10 = sVar18 + 1;
      } while (cVar4 != '\0');
      local_1a8[sVar18] = '\0';
      memcpy(v_fname,local_1a8,sVar18 + 1);
      if (*histo != 0) {
        pcVar25 = *argv;
        sVar17 = 0xffffffffffffffff;
        do {
          cVar4 = pcVar22[sVar17 + 1];
          local_1a8[sVar17 + 1] = cVar4;
          sVar17 = sVar17 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = pcVar25[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(h_fname,local_1a8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          cVar4 = h_fname[sVar17 + 1];
          local_1a8[sVar17 + 1] = cVar4;
          sVar17 = sVar17 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = "."[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(h_fname,local_1a8,sVar18 + 1);
        pcVar25 = argv[3];
        sVar17 = 0xffffffffffffffff;
        do {
          cVar4 = h_fname[sVar17 + 1];
          local_1a8[sVar17 + 1] = cVar4;
          sVar17 = sVar17 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = pcVar25[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(h_fname,local_1a8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          cVar4 = h_fname[sVar17 + 1];
          local_1a8[sVar17 + 1] = cVar4;
          sVar17 = sVar17 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = "H"[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(h_fname,local_1a8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          cVar4 = h_fname[sVar17 + 1];
          local_1a8[sVar17 + 1] = cVar4;
          sVar17 = sVar17 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar17;
        do {
          sVar18 = sVar10;
          cVar4 = local_138[sVar18 - (long)(int)sVar17];
          local_1a8[sVar18] = cVar4;
          sVar10 = sVar18 + 1;
        } while (cVar4 != '\0');
        local_1a8[sVar18] = '\0';
        memcpy(h_fname,local_1a8,sVar18 + 1);
      }
      printf(" Generated velocity filename  : %s\n",v_fname);
      printf(" Generated histogram filename : %s\n",h_fname);
      printf(" Input stem name              : %s\n",i_fname);
      printf(" Correct velocity filename    : %s\n",c_fname);
      fflush(_stdout);
      return;
    }
  }
  else {
    valid_option_cold_1();
    pcVar22 = (char *)argv;
LAB_00105064:
    valid_option_cold_15();
LAB_00105069:
    valid_option_cold_14();
LAB_0010506e:
    valid_option_cold_12();
  }
  valid_option_cold_11();
LAB_00105078:
  valid_option_cold_5();
LAB_0010507d:
  valid_option_cold_6();
LAB_00105082:
  valid_option_cold_13();
LAB_00105087:
  valid_option_cold_4();
  if ((*(int *)pcVar25 == *(int *)((long)pcVar25 + 4)) &&
     (*(int *)pcVar22 == *(int *)((long)pcVar22 + 4))) {
    return;
  }
  valid_size_cold_1();
  iVar11 = *(int *)pcVar25;
  iVar12 = *(int *)((long)pcVar25 + 4);
  iVar21 = *(int *)((long)pcVar25 + 8);
  p = (qnode_ptr_t)malloc(0x40);
  p->res = iVar11;
  p->sizx = iVar12;
  p->sizy = iVar21;
  iVar19 = 0;
  p->level = 0;
  p_00 = (qnode_ptr_t)malloc(0x40);
  p_00->res = iVar11;
  p_00->sizx = iVar12;
  p_00->sizy = iVar21;
  p_00->level = 0;
  alloc_flow(p);
  alloc_flow(p_00);
  iVar11 = *(int *)((long)pcVar25 + 8);
  if (0 < iVar11) {
    uVar14 = (ulong)*(uint *)((long)pcVar25 + 4);
    do {
      if (0 < (int)uVar14) {
        iVar11 = p_00->res;
        padVar6 = p_00->flow_ptr;
        lVar23 = 0;
        do {
          (*padVar6)[(long)iVar11 * (long)iVar19 + lVar23] =
               *(disp_vect_t *)
                (*(long *)((long)pcVar25 + 0x28) +
                ((long)*(int *)pcVar25 * (long)iVar19 + lVar23) * 8);
          lVar23 = lVar23 + 1;
          uVar14 = (ulong)*(int *)((long)pcVar25 + 4);
        } while (lVar23 < (long)uVar14);
        iVar11 = *(int *)((long)pcVar25 + 8);
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < iVar11);
  }
  if (0 < extraout_EDX) {
    iVar12 = 0;
    do {
      if (0 < iVar11) {
        uVar27 = *(uint *)((long)pcVar25 + 4);
        iVar21 = -1;
        iStack_2ac = 1;
        iVar19 = 0;
        do {
          iVar26 = iVar19 + 1;
          if (0 < (int)uVar27) {
            iVar5 = p->res;
            padVar6 = p->flow_ptr;
            uVar14 = 0;
            do {
              if (iVar11 <= iVar26) {
                auVar39 = ZEXT816(0);
              }
              else {
                dVar3 = (*p_00->flow_ptr)[(long)p_00->res * (long)iStack_2ac + uVar14];
                auVar39._0_4_ = dVar3.x + 0.0;
                auVar39._4_4_ = dVar3.y + 0.0;
                auVar39._8_8_ = 0;
              }
              bVar20 = iVar11 > iVar26;
              auVar36 = auVar39;
              if (iVar19 != 0) {
                dVar3 = (*p_00->flow_ptr)[(long)p_00->res * (long)iVar21 + uVar14];
                auVar36._0_4_ = auVar39._0_4_ + dVar3.x;
                auVar36._4_4_ = auVar39._4_4_ + dVar3.y;
                auVar36._8_4_ = auVar39._8_4_ + 0.0;
                auVar36._12_4_ = auVar39._12_4_ + 0.0;
                bVar20 = bVar20 + 1;
              }
              uVar1 = uVar14 + 1;
              auVar37 = auVar36;
              if ((long)uVar1 < (long)(int)uVar27) {
                dVar3 = (*p_00->flow_ptr)[p_00->res * iVar19 + (int)uVar14 + 1];
                auVar37._0_4_ = auVar36._0_4_ + dVar3.x;
                auVar37._4_4_ = auVar36._4_4_ + dVar3.y;
                auVar37._8_4_ = auVar36._8_4_ + 0.0;
                auVar37._12_4_ = auVar36._12_4_ + 0.0;
                bVar20 = bVar20 + 1;
              }
              auVar38 = auVar37;
              if (uVar14 != 0) {
                dVar3 = (*p_00->flow_ptr)[p_00->res * iVar19 + (int)uVar14 + -1];
                auVar38._0_4_ = auVar37._0_4_ + dVar3.x;
                auVar38._4_4_ = auVar37._4_4_ + dVar3.y;
                auVar38._8_4_ = auVar37._8_4_ + 0.0;
                auVar38._12_4_ = auVar37._12_4_ + 0.0;
                bVar20 = bVar20 + 1;
              }
              auVar9._4_4_ = (float)bVar20;
              auVar9._0_4_ = (float)bVar20;
              auVar9._8_8_ = 0;
              auVar39 = divps(auVar38,auVar9);
              (*padVar6)[(long)(iVar5 * iVar19) + uVar14] = auVar39._0_8_;
              uVar14 = uVar1;
            } while (uVar27 != uVar1);
          }
          iVar21 = iVar21 + 1;
          iStack_2ac = iStack_2ac + 1;
          iVar19 = iVar26;
        } while (iVar26 != iVar11);
        if (0 < iVar11) {
          uVar14 = (ulong)*(uint *)((long)pcVar25 + 4);
          iVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              iVar11 = p_00->res;
              padVar6 = p_00->flow_ptr;
              iVar19 = p->res;
              padVar7 = p->flow_ptr;
              lVar23 = 0;
              do {
                pcVar8 = *(char **)((long)pcVar22 + 0x20);
                lVar28 = (long)iVar21;
                lVar15 = *(int *)pcVar22 * lVar28 + lVar23;
                fVar42 = *(float *)(pcVar8 + lVar15 * 0xc + 8);
                fVar2 = *(float *)(pcVar8 + lVar15 * 0xc + 4);
                lVar24 = *(int *)pcVar25 * lVar28 + lVar23;
                fVar45 = *(float *)(*(long *)((long)pcVar25 + 0x28) + lVar24 * 8);
                fVar43 = *(float *)(*(long *)((long)pcVar25 + 0x28) + 4 + lVar24 * 8);
                dVar35 = (double)-*(float *)(pcVar8 + lVar15 * 0xc);
                dVar3 = (*padVar7)[iVar19 * iVar21 + lVar23];
                dVar32 = cos(dVar35);
                dVar33 = sin(dVar35);
                dVar34 = sin(dVar35);
                dVar35 = cos(dVar35);
                fVar30 = (float)(dVar33 * 0.0 + dVar32);
                fVar40 = (float)(dVar35 * 0.0 - dVar34);
                dVar35 = (double)-*(float *)(*(char **)((long)pcVar22 + 0x20) +
                                            (*(int *)pcVar22 * lVar28 + lVar23) * 0xc);
                dVar32 = cos(dVar35);
                dVar33 = sin(dVar35);
                dVar34 = sin(dVar35);
                dVar35 = cos(dVar35);
                fVar31 = (float)(dVar33 + dVar32 * 0.0);
                fVar41 = (float)(dVar35 + dVar34 * -0.0);
                fStack_218 = dVar3.x;
                fStack_214 = dVar3.y;
                fVar45 = fVar45 - fStack_218;
                fVar43 = fVar43 - fStack_214;
                fVar44 = (fVar45 * fVar31 + fVar41 * fVar43) * (fVar42 / (fVar42 + 1.0));
                fVar42 = (fVar45 * fVar30 + fVar40 * fVar43) * (fVar2 / (fVar2 + 1.0));
                dVar3.y = fVar42 * fVar40 + fVar44 * fVar41 + fStack_214;
                dVar3.x = fVar42 * fVar30 + fVar44 * fVar31 + fStack_218;
                (*padVar6)[iVar11 * iVar21 + lVar23] = dVar3;
                lVar23 = lVar23 + 1;
                uVar14 = (ulong)*(int *)((long)pcVar25 + 4);
              } while (lVar23 < (long)uVar14);
              iVar11 = *(int *)((long)pcVar25 + 8);
            }
            iVar21 = iVar21 + 1;
          } while (iVar21 < iVar11);
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != extraout_EDX);
  }
  if (0 < iVar11) {
    uVar14 = (ulong)*(uint *)((long)pcVar25 + 4);
    iVar12 = 0;
    do {
      if (0 < (int)uVar14) {
        iVar11 = p_00->res;
        padVar6 = p_00->flow_ptr;
        lVar23 = 0;
        do {
          *(disp_vect_t *)
           (*(long *)((long)pcVar25 + 0x28) + ((long)*(int *)pcVar25 * (long)iVar12 + lVar23) * 8) =
               (*padVar6)[(long)iVar11 * (long)iVar12 + lVar23];
          lVar23 = lVar23 + 1;
          uVar14 = (ulong)*(int *)((long)pcVar25 + 4);
        } while (lVar23 < (long)uVar14);
        iVar11 = *(int *)((long)pcVar25 + 8);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < iVar11);
  }
  dealloc_flow(p);
  dealloc_flow(p_00);
  free(p);
  free(p_00);
  return;
}

Assistant:

void valid_option(argc,argv,in_path,out_path,n1,n2,level,h_type,histo,sm,sp,sf,pyr,
ssd,f_type,trsh,i_fname,v_fname,c_fname,h_fname,nbin,incr,iter,binary,row,col)
char *argv[] ;
int argc, *n1, *n2, *iter, *level, *h_type, *histo, *sm, *sp, *sf, *pyr,
    *f_type, *nbin, *ssd, *binary, *row, *col ;
float *trsh, *incr ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ string ext, t0, str_trsh ;
  int i, fn ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 24) && (argc >= 4)) {
    *binary = FALSE ;
    *sm = TRUE ;
    *sp = TRUE ;
    *sf = FALSE ;
    *pyr = LAP ;
    *level = DEFLEVEL ;
    *histo = FALSE ;
    fn = FALSE ;
    *ssd = 3 ;
    *trsh = 0.0 ;
    *nbin = 0 ;
    *iter = RELAXITER ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-NR",argv[i]) == 0) {
      *sm = FALSE ;
      i += 1 ;
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          if (*sf == TRUE) {
            error(3) ;
          }
          *sf = TRUE ;
          *f_type = CMIN ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *h_type = CMIN ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-P",argv[i]) == 0) {
            *sp = FALSE ;
            i += 1 ;
          }
          else {
            if (strcmp("-L",argv[i]) == 0) {
              if ( i + 1 < argc) {
                sscanf(argv[i+1],"%d",level) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-I",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%d",iter) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-W",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",ssd) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-N",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",n1) ;
                      sscanf(argv[i+2],"%d",n2) ;
                      fn = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-B",argv[i]) == 0) {
                      if (i + 2 < argc) {
                        sscanf(argv[i+1],"%d",col) ;
                        sscanf(argv[i+2],"%d",row) ;
                        *binary = TRUE ;
                        i += 3 ;
                      }
                      else {
                        error(1) ;
                      }
                    }
                    else {
                      error(2) ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(13) ;
  }
  if (*level > MAXLEVEL) {
    error(4) ;
  }
  if (*ssd != 3 && *ssd != 5 && *ssd != 7) {
    error(16) ;
  }
  if (!fn) {
    error(17) ;
  }
  if (*n1 == *n2) {
    error(18) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;

  concat(in_path,argv[3],i_fname) ;

  strcpy(ext,"-n") ;
  sprintf(t0,"%d",*n1);
  concat(ext,t0,ext) ;
  concat(ext,"-",ext) ;
  sprintf(t0,"%d",*n2);
  concat(ext,t0,ext) ;
  concat(ext,"-w",ext) ;
  sprintf(t0,"%d",*ssd);
  concat(ext,t0,ext) ;
  concat(ext,"-l",ext) ;
  sprintf(t0,"%d",*level);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  if (!(*sm)) {
    concat(ext,"-r",ext) ;
  }
  if (!(*sp)) {
    concat(ext,"-s",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}